

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall gimage::Histogram::sumCols(Histogram *this,Histogram *rowhist)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  setSize(rowhist,*(int *)(this + 4),1,*(int *)(this + 8));
  if (0 < *(int *)(rowhist + 4) * *(int *)rowhist) {
    memset(*(void **)(rowhist + 0x10),0,(ulong)(uint)(*(int *)(rowhist + 4) * *(int *)rowhist) << 3)
    ;
  }
  iVar1 = *(int *)(this + 4);
  if (0 < (long)iVar1) {
    uVar2 = *(uint *)this;
    lVar3 = *(long *)(this + 0x18);
    lVar4 = *(long *)(rowhist + 0x18);
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar5 = *(long *)(lVar3 + lVar7 * 8);
        lVar6 = *(long *)(lVar4 + 8);
        lVar8 = *(long *)(lVar6 + lVar7 * 8);
        uVar9 = 0;
        do {
          lVar8 = lVar8 + *(long *)(lVar5 + uVar9 * 8);
          *(long *)(lVar6 + lVar7 * 8) = lVar8;
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void Histogram::sumCols(Histogram &rowhist) const
{
  rowhist.setSize(h, 1, bs);
  rowhist.clear();

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      rowhist(k, 1)+=row[k][i];
    }
  }
}